

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  string *psVar1;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_SOURCE_DIR",&local_29);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  value._M_str = (psVar1->_M_dataplus)._M_p;
  value._M_len = psVar1->_M_string_length;
  SetDefinition(this,&local_28,value);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_CURRENT_SOURCE_DIR",&local_29);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  value_00._M_str = (psVar1->_M_dataplus)._M_p;
  value_00._M_len = psVar1->_M_string_length;
  SetDefinition(this,&local_28,value_00);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_BINARY_DIR",&local_29);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  value_01._M_str = (psVar1->_M_dataplus)._M_p;
  value_01._M_len = psVar1->_M_string_length;
  SetDefinition(this,&local_28,value_01);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"CMAKE_CURRENT_BINARY_DIR",&local_29);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  value_02._M_str = (psVar1->_M_dataplus)._M_p;
  value_02._M_len = psVar1->_M_string_length;
  SetDefinition(this,&local_28,value_02);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}